

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameOfLife.h
# Opt level: O0

void __thiscall
GameOfLife::GameOfLife(GameOfLife *this,vector<Point,_std::allocator<Point>_> *alivePoints)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  vector<Point,_std::allocator<Point>_> *in_RDI;
  vector<Point,_std::allocator<Point>_> *unaff_retaddr;
  allocator<char> local_25 [5];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  std::vector<Point,_std::allocator<Point>_>::vector(unaff_retaddr,in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::allocator<char>::~allocator(local_25);
  return;
}

Assistant:

explicit GameOfLife(std::vector<Point>& alivePoints) : aliveCells(alivePoints)
    {
    }